

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_set_quantize_dither(fitsfile *fptr,int dither,int *status)

{
  if (dither - 3U < 0xfffffffc) {
    ffpmsg("illegal dithering value (fits_set_quantize_method)");
    *status = 0x19d;
  }
  else {
    fptr->Fptr->request_quantize_method = dither + (uint)(dither == 0);
  }
  return *status;
}

Assistant:

int fits_set_quantize_dither(fitsfile *fptr,  /* I - FITS file pointer   */
           int dither,        /* dither type      */
           int *status)         /* IO - error status                */
{
/*
   the name of this routine has changed.  This is kept here only for backwards
   compatibility for any software that may be calling the old routine.
*/

    fits_set_quantize_method(fptr, dither, status);
    return(*status);
}